

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_add_mem_to_archive_file_in_place
                  (char *pZip_filename,char *pArchive_name,void *pBuf,size_t buf_size,void *pComment
                  ,mz_uint16 comment_size,mz_uint level_and_flags)

{
  char cVar1;
  int iVar2;
  mz_bool mVar3;
  mz_bool mVar4;
  mz_bool mVar5;
  char *pcVar6;
  uint level_and_flags_00;
  mz_zip_archive zip_archive;
  stat file_stat;
  
  zip_archive.m_archive_size = 0;
  zip_archive.m_central_directory_file_ofs = 0;
  zip_archive.m_total_files = 0;
  zip_archive.m_zip_mode = MZ_ZIP_MODE_INVALID;
  zip_archive.m_zip_type = MZ_ZIP_TYPE_INVALID;
  zip_archive.m_last_error = MZ_ZIP_NO_ERROR;
  zip_archive.m_file_offset_alignment = 0;
  zip_archive.m_pAlloc = (mz_alloc_func)0x0;
  zip_archive.m_pFree = (mz_free_func)0x0;
  zip_archive.m_pRealloc = (mz_realloc_func)0x0;
  zip_archive.m_pAlloc_opaque = (void *)0x0;
  zip_archive.m_pRead = (mz_file_read_func)0x0;
  zip_archive.m_pWrite = (mz_file_write_func)0x0;
  zip_archive.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  zip_archive.m_pIO_opaque = (void *)0x0;
  zip_archive.m_pState = (mz_zip_internal_state *)0x0;
  level_and_flags_00 = 6;
  if (-1 < (int)level_and_flags) {
    level_and_flags_00 = level_and_flags;
  }
  if (pArchive_name == (char *)0x0 || pZip_filename == (char *)0x0) {
    return 0;
  }
  if (pBuf == (void *)0x0 && buf_size != 0) {
    return 0;
  }
  if ((level_and_flags_00 & 0xf) < 0xb && (pComment != (void *)0x0 || comment_size == 0)) {
    pcVar6 = pArchive_name;
    if (*pArchive_name == '/') {
      return 0;
    }
    for (; cVar1 = *pcVar6, cVar1 != '\0'; pcVar6 = pcVar6 + 1) {
      if (cVar1 == ':') {
        return 0;
      }
      if (cVar1 == '\\') {
        return 0;
      }
    }
    iVar2 = stat(pZip_filename,(stat *)&file_stat);
    if (iVar2 == 0) {
      mVar3 = mz_zip_reader_init_file(&zip_archive,pZip_filename,level_and_flags_00 | 0x800);
      if (mVar3 == 0) {
        return 0;
      }
      mVar3 = mz_zip_writer_init_from_reader(&zip_archive,pZip_filename);
      if (mVar3 == 0) {
        mz_zip_reader_end(&zip_archive);
        return 0;
      }
    }
    else {
      mVar3 = mz_zip_writer_init_file(&zip_archive,pZip_filename,0);
      if (mVar3 == 0) {
        return 0;
      }
    }
    mVar3 = mz_zip_writer_add_mem_ex
                      (&zip_archive,pArchive_name,pBuf,buf_size,pComment,comment_size,
                       level_and_flags_00,0,0);
    mVar4 = mz_zip_writer_finalize_archive(&zip_archive);
    mVar5 = mz_zip_writer_end(&zip_archive);
    if (mVar4 == 0) {
      mVar3 = 0;
    }
    if (mVar5 == 0) {
      mVar3 = 0;
    }
    if ((iVar2 != 0) && (mVar3 == 0)) {
      remove(pZip_filename);
    }
    return mVar3;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_add_mem_to_archive_file_in_place(
    const char *pZip_filename, const char *pArchive_name, const void *pBuf,
    size_t buf_size, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags) {
  mz_bool status, created_new_archive = MZ_FALSE;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  MZ_CLEAR_OBJ(zip_archive);
  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  if ((!pZip_filename) || (!pArchive_name) || ((buf_size) && (!pBuf)) ||
      ((comment_size) && (!pComment)) ||
      ((level_and_flags & 0xF) > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;
  if (MZ_FILE_STAT(pZip_filename, &file_stat) != 0) {
    // Create a new archive.
    if (!mz_zip_writer_init_file(&zip_archive, pZip_filename, 0))
      return MZ_FALSE;
    created_new_archive = MZ_TRUE;
  } else {
    // Append to an existing archive.
    if (!mz_zip_reader_init_file(&zip_archive, pZip_filename,
                                 level_and_flags |
                                     MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
      return MZ_FALSE;
    if (!mz_zip_writer_init_from_reader(&zip_archive, pZip_filename)) {
      mz_zip_reader_end(&zip_archive);
      return MZ_FALSE;
    }
  }
  status =
      mz_zip_writer_add_mem_ex(&zip_archive, pArchive_name, pBuf, buf_size,
                               pComment, comment_size, level_and_flags, 0, 0);
  // Always finalize, even if adding failed for some reason, so we have a valid
  // central directory. (This may not always succeed, but we can try.)
  if (!mz_zip_writer_finalize_archive(&zip_archive))
    status = MZ_FALSE;
  if (!mz_zip_writer_end(&zip_archive))
    status = MZ_FALSE;
  if ((!status) && (created_new_archive)) {
    // It's a new archive and something went wrong, so just delete it.
    int ignoredStatus = MZ_DELETE_FILE(pZip_filename);
    (void)ignoredStatus;
  }
  return status;
}